

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_loader.cpp
# Opt level: O3

ze_result_t __thiscall
loader::context_t::check_drivers
          (context_t *this,ze_init_flags_t flags,ze_init_driver_type_desc_t *desc,
          ze_global_dditable_t *globalInitStored,zes_global_dditable_t *sysmanGlobalInitStored,
          bool *requireDdiReinit,bool sysmanOnly)

{
  ulong uVar1;
  driver_vector_t *pdVar2;
  ze_result_t zVar3;
  long *plVar4;
  undefined8 *puVar5;
  byte *pbVar6;
  iterator __position;
  uint uVar7;
  int iVar8;
  ulong *puVar9;
  long *plVar10;
  ze_result_t result;
  ulong uVar11;
  undefined8 uVar12;
  bool bVar13;
  bool bVar14;
  string initName;
  string freeLibraryErrorValue;
  string errorMessage;
  long *local_230;
  char *local_228;
  long local_220;
  long lStack_218;
  ulong *local_210;
  undefined8 local_208;
  ulong local_200;
  undefined8 uStack_1f8;
  ulong *local_1f0;
  ze_init_driver_type_desc_t *local_1e8;
  ulong local_1e0;
  long lStack_1d8;
  undefined4 local_1d0;
  ze_result_t local_1cc;
  string local_1c8;
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ze_init_flags_t local_188;
  uint local_184;
  driver_vector_t *local_180;
  string local_178;
  bool *local_158;
  long local_150;
  ze_init_driver_type_desc_t *local_148;
  ze_global_dditable_t *local_140;
  zes_global_dditable_t *local_138;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_188 = flags;
  local_158 = requireDdiReinit;
  local_140 = globalInitStored;
  local_138 = sysmanGlobalInitStored;
  if (this->debugTraceEnabled == true) {
    local_1a8 = &local_198;
    if (desc != (ze_init_driver_type_desc_t *)0x0) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"desc->flags=","");
      plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x1ca9c6);
      puVar9 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar9) {
        local_1e0 = *puVar9;
        lStack_1d8 = plVar4[3];
        local_1f0 = &local_1e0;
      }
      else {
        local_1e0 = *puVar9;
        local_1f0 = (ulong *)*plVar4;
      }
      local_1e8 = (ze_init_driver_type_desc_t *)plVar4[1];
      *plVar4 = (long)puVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      to_string_abi_cxx11_(&local_1c8,(loader *)desc,local_1e8);
      uVar1 = (long)&local_1e8->stype + local_1c8._M_string_length;
      uVar11 = 0xf;
      if (local_1f0 != &local_1e0) {
        uVar11 = local_1e0;
      }
      if (uVar11 < uVar1) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          uVar12 = local_1c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < uVar1) goto LAB_0017ec0e;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f0);
      }
      else {
LAB_0017ec0e:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_1f0,(ulong)local_1c8._M_dataplus._M_p);
      }
      local_210 = &local_200;
      puVar9 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar9) {
        local_200 = *puVar9;
        uStack_1f8 = puVar5[3];
      }
      else {
        local_200 = *puVar9;
        local_210 = (ulong *)*puVar5;
      }
      local_208 = puVar5[1];
      *puVar5 = puVar9;
      puVar5[1] = 0;
      *(undefined1 *)puVar9 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_220 = *plVar10;
        lStack_218 = plVar4[3];
        local_230 = &local_220;
      }
      else {
        local_220 = *plVar10;
        local_230 = (long *)*plVar4;
      }
      local_228 = (char *)plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_1f0 != &local_1e0) {
        operator_delete(local_1f0,local_1e0 + 1);
      }
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,local_230,local_228 + (long)local_230);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
      debug_trace_message(this,&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (local_230 != &local_220) {
        operator_delete(local_230,local_220 + 1);
      }
      goto LAB_0017edef;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"flags=","");
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_1a8,0,(char *)0x0,0x1ca9c6);
    puVar9 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar9) {
      local_1e0 = *puVar9;
      lStack_1d8 = plVar4[3];
      local_1f0 = &local_1e0;
    }
    else {
      local_1e0 = *puVar9;
      local_1f0 = (ulong *)*plVar4;
    }
    local_1e8 = (ze_init_driver_type_desc_t *)plVar4[1];
    *plVar4 = (long)puVar9;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    to_string_abi_cxx11_(&local_1c8,(loader *)(ulong)local_188,(ze_init_flags_t)local_1e8);
    uVar1 = (long)&local_1e8->stype + local_1c8._M_string_length;
    uVar11 = 0xf;
    if (local_1f0 != &local_1e0) {
      uVar11 = local_1e0;
    }
    if (uVar11 < uVar1) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        uVar12 = local_1c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < uVar1) goto LAB_0017ef83;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f0);
    }
    else {
LAB_0017ef83:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1c8._M_dataplus._M_p)
      ;
    }
    local_210 = &local_200;
    puVar9 = puVar5 + 2;
    if ((ulong *)*puVar5 == puVar9) {
      local_200 = *puVar9;
      uStack_1f8 = puVar5[3];
    }
    else {
      local_200 = *puVar9;
      local_210 = (ulong *)*puVar5;
    }
    local_208 = puVar5[1];
    *puVar5 = puVar9;
    puVar5[1] = 0;
    *(undefined1 *)puVar9 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_210);
    plVar10 = plVar4 + 2;
    if ((long *)*plVar4 == plVar10) {
      local_220 = *plVar10;
      lStack_218 = plVar4[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar10;
      local_230 = (long *)*plVar4;
    }
    local_228 = (char *)plVar4[1];
    *plVar4 = (long)plVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8,local_198 + 1);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_230,local_228 + (long)local_230);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
    debug_trace_message(this,&local_90,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
LAB_0017f164:
    bVar13 = true;
  }
  else {
    if (desc == (ze_init_driver_type_desc_t *)0x0) goto LAB_0017f164;
LAB_0017edef:
    if (*(char *)(context + 0x162a) == '\0') {
      if (this->debugTraceEnabled != true) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      local_230 = &local_220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,
                 "zeInitDrivers called first, but not supported by driver, returning uninitialized."
                 ,"");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_230,local_228 + (long)local_230);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
      debug_trace_message(this,&local_d0,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_230 == &local_220) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      operator_delete(local_230,local_220 + 1);
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    bVar13 = false;
  }
  local_230 = &local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"zeInit","");
  if (!bVar13) {
    std::__cxx11::string::_M_replace((ulong)&local_230,0,local_228,0x1caa3b);
  }
  if (sysmanOnly) {
    std::__cxx11::string::_M_replace((ulong)&local_230,0,local_228,0x1caa49);
    local_180 = &this->zesDrivers;
  }
  else {
    local_180 = &this->zeDrivers;
  }
  __position._M_current =
       (local_180->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_150 = (long)(local_180->
                    super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl
                    .super__Vector_impl_data._M_finish - (long)__position._M_current;
  bVar13 = local_150 != 0xd98;
  pbVar6 = (byte *)getenv("ZE_ENABLE_PCI_ID_DEVICE_ORDER");
  if (pbVar6 == (byte *)0x0) {
LAB_0017f233:
    local_1d0 = 0;
  }
  else {
    if (*pbVar6 == 0x30) {
      iVar8 = 1;
      if (pbVar6[1] == 0) goto LAB_0017f233;
    }
    else {
      uVar7 = *pbVar6 - 0x31;
      if (uVar7 == 0) {
        uVar7 = (uint)pbVar6[1];
      }
      iVar8 = -uVar7;
    }
    local_1d0 = (undefined4)CONCAT71((int7)((ulong)pbVar6 >> 8),iVar8 == 0);
  }
  pbVar6 = (byte *)getenv("ZET_ENABLE_PROGRAM_INSTRUMENTATION");
  if (pbVar6 == (byte *)0x0) {
LAB_0017f27d:
    bVar14 = false;
  }
  else {
    if (*pbVar6 == 0x30) {
      iVar8 = 1;
      if (pbVar6[1] == 0) goto LAB_0017f27d;
    }
    else {
      uVar7 = *pbVar6 - 0x31;
      if (uVar7 == 0) {
        uVar7 = (uint)pbVar6[1];
      }
      iVar8 = -uVar7;
    }
    bVar14 = iVar8 == 0;
  }
  *(bool *)(context + 0x165d) = bVar14;
  local_184 = (uint)sysmanOnly;
  local_148 = desc;
  do {
    if (__position._M_current ==
        (local_180->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)._M_impl
        .super__Vector_impl_data._M_finish) {
      local_1cc = ZE_RESULT_ERROR_UNINITIALIZED;
      if (__position._M_current !=
          (local_180->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        local_1cc = ZE_RESULT_SUCCESS;
      }
      break;
    }
    (__position._M_current)->pciOrderingRequested = SUB41(local_1d0,0);
    local_210 = &local_200;
    local_208 = 0;
    local_200 = local_200 & 0xffffffffffffff00;
    zVar3 = init_driver(this,__position._M_current,local_188,local_148,local_140,local_138,
                        SUB41(local_184,0));
    if (zVar3 == ZE_RESULT_SUCCESS) {
      (__position._M_current)->driverInuse = true;
      __position._M_current = __position._M_current + 1;
      bVar14 = true;
    }
    else {
      if (((__position._M_current)->driverInuse == false) && (*(char *)(context + 0x162a) == '\0'))
      {
        if (this->debugTraceEnabled == true) {
          std::operator+(&local_110,"Check Drivers Failed on ",&(__position._M_current)->name);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
          puVar9 = (ulong *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar9) {
            local_1c8.field_2._M_allocated_capacity = *puVar9;
            local_1c8.field_2._8_8_ = plVar4[3];
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *puVar9;
            local_1c8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_1c8._M_string_length = plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_230);
          plVar10 = plVar4 + 2;
          if ((long *)*plVar4 == plVar10) {
            local_198 = *plVar10;
            lStack_190 = plVar4[3];
            local_1a8 = &local_198;
          }
          else {
            local_198 = *plVar10;
            local_1a8 = (long *)*plVar4;
          }
          local_1a0 = plVar4[1];
          *plVar4 = (long)plVar10;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          puVar9 = (ulong *)(plVar4 + 2);
          if ((ulong *)*plVar4 == puVar9) {
            local_1e0 = *puVar9;
            lStack_1d8 = plVar4[3];
            local_1f0 = &local_1e0;
          }
          else {
            local_1e0 = *puVar9;
            local_1f0 = (ulong *)*plVar4;
          }
          local_1e8 = (ze_init_driver_type_desc_t *)plVar4[1];
          *plVar4 = (long)puVar9;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if (local_1a8 != &local_198) {
            operator_delete(local_1a8,local_198 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,local_1f0,(long)&local_1e8->stype + (long)local_1f0);
          to_string_abi_cxx11_(&local_130,(loader *)(ulong)zVar3,result);
          debug_trace_message(this,&local_178,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_dataplus._M_p != &local_178.field_2) {
            operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
          }
          if (local_1f0 != &local_1e0) {
            operator_delete(local_1f0,local_1e0 + 1);
          }
        }
        pdVar2 = local_180;
        __position = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::_M_erase
                               (local_180,__position);
        if (((long)(pdVar2->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pdVar2->super__Vector_base<loader::driver_t,_std::allocator<loader::driver_t>_>)
                   ._M_impl.super__Vector_impl_data._M_start == 0xd98) &&
           (*(char *)(context + 0x1629) == '\0')) {
          *local_158 = true;
        }
      }
      else {
        __position._M_current = __position._M_current + 1;
      }
      bVar14 = bVar13;
      if (local_150 == 0xd98) {
        local_1cc = zVar3;
      }
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
  } while (bVar14);
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  return local_1cc;
}

Assistant:

ze_result_t context_t::check_drivers(ze_init_flags_t flags, ze_init_driver_type_desc_t* desc, ze_global_dditable_t *globalInitStored, zes_global_dditable_t *sysmanGlobalInitStored, bool *requireDdiReinit, bool sysmanOnly) {
        if (debugTraceEnabled) {
            if (desc) {
                std::string message = "check_drivers(" + std::string("desc->flags=") + loader::to_string(desc) + ")";
                debug_trace_message(message, "");
            } else {
                std::string message = "check_drivers(" + std::string("flags=") + loader::to_string(flags) + ")";
                debug_trace_message(message, "");
            }
        }
        // If zeInitDrivers is not supported by this driver, but zeInitDrivers is called first, then return uninitialized.
        if (desc && !loader::context->initDriversSupport) {
            if (debugTraceEnabled) {
                std::string message = "zeInitDrivers called first, but not supported by driver, returning uninitialized.";
                debug_trace_message(message, "");
            }
            return ZE_RESULT_ERROR_UNINITIALIZED;
        }


        bool return_first_driver_result=false;
        std::string initName = "zeInit";
        driver_vector_t *drivers = &zeDrivers;
        // If desc is set, then this is zeInitDrivers.
        if (desc) {
            initName = "zeInitDrivers";
        }
        // If this is sysmanOnly check_drivers, then zesInit is being called and we need to use zesDrivers.
        if (sysmanOnly) {
            drivers = &zesDrivers;
            initName = "zesInit";
        }
        if(drivers->size()==1) {
            return_first_driver_result=true;
        }
        bool pciOrderingRequested = getenv_tobool( "ZE_ENABLE_PCI_ID_DEVICE_ORDER" );
        loader::context->instrumentationEnabled = getenv_tobool( "ZET_ENABLE_PROGRAM_INSTRUMENTATION" );

        for(auto it = drivers->begin(); it != drivers->end(); )
        {
            it->pciOrderingRequested = pciOrderingRequested;
            std::string freeLibraryErrorValue;
            ze_result_t result = init_driver(*it, flags, desc, globalInitStored, sysmanGlobalInitStored, sysmanOnly);
            if(result != ZE_RESULT_SUCCESS) {
                // If the driver has already been init and handles are to be read, then this driver cannot be removed from the list.
                // Also, if any driver supports zeInitDrivers, then no driver can be removed to allow for different sets of drivers.
                if (!it->driverInuse && !loader::context->initDriversSupport) {
                    if (debugTraceEnabled) {
                        std::string errorMessage = "Check Drivers Failed on " + it->name + " , driver will be removed. " + initName + " failed with ";
                        debug_trace_message(errorMessage, loader::to_string(result));
                    }
                    it = drivers->erase(it);
                    // If the number of drivers is now ==1, then we need to reinit the ddi tables to pass through.
                    // If ZE_ENABLE_LOADER_INTERCEPT is set to 1, then even if drivers were removed, don't reinit the ddi tables.
                    if (drivers->size() == 1 && !loader::context->forceIntercept) {
                        *requireDdiReinit = true;
                    }
                } else {
                    it++;
                }
                if(return_first_driver_result)
                    return result;
            } else {
                // If this is a single driver system, then the first success for this driver needs to be set.
                it->driverInuse = true;
                it++;
            }
        }

        if(drivers->size() == 0)
            return ZE_RESULT_ERROR_UNINITIALIZED;

        return ZE_RESULT_SUCCESS;
    }